

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ArenaStringPtr::Set
          (ArenaStringPtr *this,string *default_value,ConstStringParam value,Arena *arena)

{
  string *psVar1;
  string *this_00;
  
  psVar1 = (string *)(this->tagged_ptr_).ptr_;
  if (psVar1 != default_value) {
    std::__cxx11::string::assign((char *)psVar1,(ulong)(value->_M_dataplus)._M_p);
    return;
  }
  if (arena == (Arena *)0x0) {
    this_00 = (string *)operator_new(0x20);
    std::__cxx11::string::string(this_00,(string *)value);
  }
  else {
    ArenaImpl::RecordAlloc((ArenaImpl *)arena,(type_info *)&std::__cxx11::string::typeinfo,0x20);
    this_00 = (string *)
              ArenaImpl::AllocateAlignedAndAddCleanup
                        ((ArenaImpl *)arena,0x20,arena_destruct_object<std::__cxx11::string>);
    std::__cxx11::string::string(this_00,(string *)value);
  }
  (this->tagged_ptr_).ptr_ = this_00;
  return;
}

Assistant:

void ArenaStringPtr::Set(const std::string* default_value,
                         ConstStringParam value, ::google::protobuf::Arena* arena) {
  if (IsDefault(default_value)) {
    tagged_ptr_.Set(Arena::Create<std::string>(arena, value));
  } else {
    UnsafeMutablePointer()->assign(value.data(), value.length());
  }
}